

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::CreateBCGeoBlendEl
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,int side,int bc)

{
  int iVar1;
  MElementType MVar2;
  long lVar3;
  long *plVar4;
  TPZGeoMesh *pTVar5;
  TPZManVector<long,_10> *this_00;
  uint in_EDX;
  int in_ESI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide newelside;
  TPZGeoElSide me;
  TPZGeoEl *newel;
  MElementType BCtype;
  TPZGeoMesh *mesh;
  int64_t index;
  int inode;
  TPZManVector<long,_10> nodeindices;
  int sidennodes;
  undefined8 in_stack_fffffffffffffed0;
  int side_00;
  TPZManVector<long,_10> *this_01;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  TPZManVector<long,_10> *this_02;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  TPZManVector<long,_10> *in_stack_fffffffffffffef0;
  undefined1 local_a8 [28];
  int local_8c;
  TPZVec<long> local_88 [2];
  TPZGeoElSide *in_stack_ffffffffffffffc8;
  TPZGeoElSide *in_stack_ffffffffffffffd0;
  undefined4 extraout_var;
  
  iVar1 = pztopology::TPZPoint::NSideNodes(in_ESI);
  TPZManVector<long,_10>::TPZManVector
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
            );
  for (local_8c = 0; side_00 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20), local_8c < iVar1;
      local_8c = local_8c + 1) {
    lVar3 = (**(code **)(*(long *)in_RDI + 0x128))(in_RDI,in_ESI,local_8c);
    plVar4 = TPZVec<long>::operator[](local_88,(long)local_8c);
    *plVar4 = lVar3;
  }
  pTVar5 = TPZGeoEl::Mesh(in_RDI);
  MVar2 = pztopology::TPZPoint::Type(in_ESI);
  iVar1 = (*(pTVar5->super_TPZSavable)._vptr_TPZSavable[0xd])
                    (pTVar5,(ulong)MVar2,local_88,(ulong)in_EDX,local_a8);
  this_00 = (TPZManVector<long,_10> *)CONCAT44(extraout_var,iVar1);
  this_02 = this_00;
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)this_00,
             (TPZGeoEl *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),side_00);
  this_01 = this_00;
  iVar1 = (*(this_00->super_TPZVec<long>)._vptr_TPZVec[0x1e])();
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)this_02,(TPZGeoEl *)CONCAT44(iVar1,in_stack_fffffffffffffed8),
             (int)((ulong)this_01 >> 0x20));
  TPZGeoElSide::InsertConnectivity(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (*(this_00->super_TPZVec<long>)._vptr_TPZVec[0xf])();
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1670312);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x167031c);
  TPZManVector<long,_10>::~TPZManVector(this_01);
  return (TPZGeoEl *)this_00;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc)
{
	int sidennodes = TGeo::NSideNodes(side);
	TPZManVector<int64_t> nodeindices(sidennodes);
	int inode;
	for(inode=0; inode<sidennodes; inode++){
		nodeindices[inode] = this->SideNodeIndex(side,inode);
	}
	int64_t index;
	
	TPZGeoMesh *mesh = this->Mesh();
	MElementType BCtype = TGeo::Type(side);
	
	TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
	TPZGeoElSide me(this,side);
	TPZGeoElSide newelside(newel,newel->NSides()-1);
	
	newelside.InsertConnectivity(me);
	newel->Initialize();
	
	return newel;
}